

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::node::announce
          (node *this,sha1_hash *info_hash,int listen_port,announce_flags_t flags,
          function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
          *f)

{
  dht_observer *pdVar1;
  sha1_hash *info_hash_00;
  bool bVar2;
  uint uVar3;
  difference_type dVar4;
  undefined7 in_register_00000009;
  span<const_char> in;
  reference_wrapper<libtorrent::dht::node> local_f0;
  _func_void_vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_ptr_node_ptr_int_digest32<160L>_ptr_bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>
  *local_e8;
  type local_e0;
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  local_b0;
  function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  local_90;
  undefined1 local_6f;
  uchar local_6e;
  bitfield_flag local_6d [13];
  aux *local_60;
  char *local_58;
  string local_50;
  function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  *local_30;
  function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  *f_local;
  sha1_hash *psStack_20;
  int listen_port_local;
  sha1_hash *info_hash_local;
  node *this_local;
  announce_flags_t flags_local;
  
  dVar4 = CONCAT71(in_register_00000009,flags.m_val);
  local_30 = f;
  f_local._4_4_ = listen_port;
  psStack_20 = info_hash;
  info_hash_local = (sha1_hash *)this;
  this_local._7_1_ = flags.m_val;
  if ((this->m_observer != (dht_observer *)0x0) &&
     (uVar3 = (**(this->m_observer->super_dht_logger)._vptr_dht_logger)(this->m_observer,1),
     (uVar3 & 1) != 0)) {
    pdVar1 = this->m_observer;
    span<char_const>::span<libtorrent::digest32<160l>,char,void>
              ((span<char_const> *)&local_60,psStack_20);
    in.m_len = dVar4;
    in.m_ptr = local_58;
    libtorrent::aux::to_hex_abi_cxx11_(&local_50,local_60,in);
    dVar4 = ::std::__cxx11::string::c_str();
    (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
              (pdVar1,1,"announcing [ ih: %s p: %d ]",dVar4,(ulong)f_local._4_4_);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  if ((f_local._4_4_ == 0) && (this->m_observer != (dht_observer *)0x0)) {
    pdVar1 = this->m_observer;
    local_6e = this_local._7_1_;
    local_6f = 4;
    local_6d[0] = (bitfield_flag)
                  libtorrent::flags::operator&
                            ((bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>
                              )this_local._7_1_,
                             (bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void>
                              )0x4);
    bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(local_6d);
    f_local._4_4_ =
         (*(pdVar1->super_dht_logger)._vptr_dht_logger[4])
                   (pdVar1,(ulong)bVar2,&this->m_sock,CONCAT71((int7)((ulong)dVar4 >> 8),bVar2));
  }
  info_hash_00 = psStack_20;
  ::std::
  function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  ::function(&local_90,f);
  local_e8 = anon_unknown_0::announce_fun;
  local_f0 = ::std::ref<libtorrent::dht::node>(this);
  ::std::
  bind<void(*)(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&,libtorrent::dht::node&,int,libtorrent::digest32<160l>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::dht::dht_announce_flag_tag,void>),std::_Placeholder<1>const&,std::reference_wrapper<libtorrent::dht::node>,int&,libtorrent::digest32<160l>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::dht::dht_announce_flag_tag,void>const&>
            (&local_e0,&local_e8,(_Placeholder<1> *)&::std::placeholders::_1,&local_f0,
             (int *)((long)&f_local + 4),psStack_20,
             (bitfield_flag<unsigned_char,_libtorrent::dht::dht_announce_flag_tag,_void> *)
             ((long)&this_local + 7));
  ::std::
  function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>
  ::
  function<std::_Bind<void(*(std::_Placeholder<1>,std::reference_wrapper<libtorrent::dht::node>,int,libtorrent::digest32<160l>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::dht::dht_announce_flag_tag,void>))(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&,libtorrent::dht::node&,int,libtorrent::digest32<160l>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::dht::dht_announce_flag_tag,void>)>,void>
            ((function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>
              *)&local_b0,&local_e0);
  get_peers(this,info_hash_00,&local_90,&local_b0,this_local._7_1_);
  ::std::
  function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
  ::~function(&local_b0);
  ::std::
  function<void_(const_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  ::~function(&local_90);
  return;
}

Assistant:

void node::announce(sha1_hash const& info_hash, int listen_port, announce_flags_t const flags
	, std::function<void(std::vector<tcp::endpoint> const&)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		m_observer->log(dht_logger::node, "announcing [ ih: %s p: %d ]"
			, aux::to_hex(info_hash).c_str(), listen_port);
	}
#endif

	if (listen_port == 0 && m_observer != nullptr)
	{
		listen_port = m_observer->get_listen_port(
			(flags & announce::ssl_torrent) ? aux::transport::ssl : aux::transport::plaintext
			, m_sock);
	}

	get_peers(info_hash, std::move(f)
		, std::bind(&announce_fun, _1, std::ref(*this)
		, listen_port, info_hash, flags), flags);
}